

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O0

void aom_highbd_quantize_b_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint16_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i dequant_00;
  __m256i dequant_01;
  __m256i dequant_02;
  __m256i dequant_03;
  __m256i coeff1_00;
  __m256i qcoeff_00;
  __m256i qcoeff_01;
  __m256i coeff1_01;
  __m256i coeff1_02;
  __m256i qcoeff_02;
  __m256i qcoeff_03;
  __m256i coeff1_03;
  __m256i coeff0_00;
  __m256i coeff0_01;
  __m256i coeff0_02;
  __m256i coeff0_03;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  uint uVar12;
  uint uVar13;
  long in_RDX;
  long in_RSI;
  int16_t *piVar14;
  undefined1 (*in_RDI) [32];
  tran_low_t *ptVar15;
  tran_low_t *in_R9;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  __m128i mask;
  __m128i mask_00;
  undefined8 *in_stack_00000008;
  int prescan_add_val;
  int factor;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc_3;
  int qcoeff;
  int rc_2;
  int i_3;
  int rc_1;
  int i_2;
  int rc;
  int i_1;
  __m256i temp1;
  __m256i temp0;
  int first;
  __m256i threshold [2];
  int i;
  qm_val_t wt;
  int log_scale;
  int thresh [2];
  int prescan_add [2];
  __m128i temp_mask1;
  __m128i temp_mask0;
  __m256i mask1;
  __m256i mask0;
  __m256i cmp_mask;
  __m256i qcoeff1;
  __m256i coeff1;
  __m256i qcoeff0;
  __m256i coeff0;
  __m256i shift;
  __m256i dequant;
  __m256i quant;
  __m256i round;
  __m256i zbin;
  __m256i zero;
  int eob;
  int is_found1;
  int is_found0;
  int non_zero_count_prescan_add_zero;
  int non_zero_count;
  int index;
  tran_low_t *ptVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  int16_t *in_stack_fffffffffffff2a0;
  undefined1 *in_stack_fffffffffffff2a8;
  undefined1 *in_stack_fffffffffffff2b0;
  __m256i *in_stack_fffffffffffff2b8;
  undefined4 in_stack_fffffffffffff2c0;
  undefined4 in_stack_fffffffffffff2cc;
  undefined4 in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d4;
  undefined4 in_stack_fffffffffffff2d8;
  undefined4 in_stack_fffffffffffff2dc;
  undefined4 in_stack_fffffffffffff2e0;
  undefined4 in_stack_fffffffffffff2e4;
  undefined4 in_stack_fffffffffffff2e8;
  undefined4 in_stack_fffffffffffff2ec;
  undefined4 in_stack_fffffffffffff2f0;
  undefined4 in_stack_fffffffffffff2f4;
  int iVar27;
  int local_d04;
  undefined8 local_d00;
  __m256i *mask_01;
  int *is_found;
  int16_t *iscan_ptr;
  __m256i *threshold_00;
  undefined1 local_ce0 [32];
  undefined8 uStack_cc8;
  int local_ca4;
  undefined1 local_ca0 [32];
  int local_c5c;
  undefined4 local_c54;
  uint local_c50 [4];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [32];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  int local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  long local_a38;
  long local_a30;
  undefined1 (*local_a28) [32];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  uint local_9e8;
  uint local_9e4;
  undefined1 (*local_9e0) [32];
  undefined1 (*local_9d8) [32];
  undefined1 (*local_9d0) [32];
  undefined1 (*local_9c8) [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  long lStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  long lStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  tran_low_t *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  tran_low_t *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  tran_low_t *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  tran_low_t *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  __m256i *qcoeff1_00;
  __m256i *qcoeff0_00;
  
  local_a54 = 0x10;
  local_a58 = 0;
  local_a5c = 0;
  local_a60 = 0;
  local_a64 = 0;
  local_a68 = -1;
  local_a20 = 0;
  uStack_a18 = 0;
  uStack_a10 = 0;
  uStack_a08 = 0;
  local_aa0 = 0;
  uStack_a98 = 0;
  uStack_a90 = 0;
  uStack_a88 = 0;
  local_c00 = 0;
  uStack_bf8 = 0;
  uStack_bf0 = 0;
  uStack_be8 = 0;
  local_c20 = 0;
  uStack_c18 = 0;
  uStack_c10 = 0;
  uStack_c08 = 0;
  local_c54 = 0;
  for (local_c5c = 0; local_c5c < 2; local_c5c = local_c5c + 1) {
    local_c50[(long)local_c5c + 2] =
         *(short *)((long)dqcoeff_ptr + (long)local_c5c * 2) * 0x145 + 0x40 >> 7;
    local_c50[local_c5c] =
         (*(short *)(in_RDX + (long)local_c5c * 2) * 0x20 + local_c50[(long)local_c5c + 2]) - 1;
  }
  local_9e4 = local_c50[0];
  local_84 = local_c50[0];
  local_88 = local_c50[0];
  local_8c = local_c50[0];
  local_90 = local_c50[0];
  local_94 = local_c50[0];
  local_98 = local_c50[0];
  local_9c = local_c50[0];
  local_a0 = local_c50[0];
  auVar2 = vpinsrd_avx(ZEXT416(local_c50[0]),local_c50[0],1);
  auVar2 = vpinsrd_avx(auVar2,local_c50[0],2);
  local_c0 = vpinsrd_avx(auVar2,local_c50[0],3);
  auVar2 = vpinsrd_avx(ZEXT416(local_c50[0]),local_c50[0],1);
  auVar2 = vpinsrd_avx(auVar2,local_c50[0],2);
  auStack_b0 = vpinsrd_avx(auVar2,local_c50[0],3);
  local_ca0._16_8_ = auStack_b0._0_8_;
  local_ca0._0_16_ = local_c0;
  local_ca0._24_8_ = auStack_b0._8_8_;
  local_9e8 = local_c50[1];
  local_34 = local_c50[1];
  local_38 = local_c50[1];
  local_3c = local_c50[1];
  local_40 = local_c50[1];
  local_44 = local_c50[1];
  local_48 = local_c50[1];
  local_4c = local_c50[1];
  local_50 = local_c50[1];
  auVar2 = vpinsrd_avx(ZEXT416(local_c50[1]),local_c50[1],1);
  auVar2 = vpinsrd_avx(auVar2,local_c50[1],2);
  local_80 = vpinsrd_avx(auVar2,local_c50[1],3);
  auVar2 = vpinsrd_avx(ZEXT416(local_c50[1]),local_c50[1],1);
  auVar2 = vpinsrd_avx(auVar2,local_c50[1],2);
  auStack_70 = vpinsrd_avx(auVar2,local_c50[1],3);
  auVar3._16_8_ = auStack_70._0_8_;
  auVar3._0_16_ = local_80;
  auVar3._24_8_ = auStack_70._8_8_;
  vpblendd_avx2(auVar3,local_ca0,1);
  local_ca4 = -1;
  puVar26 = local_b40;
  puVar25 = local_b20;
  ptVar24 = dqcoeff_ptr;
  local_a38 = in_RDX;
  local_a30 = in_RSI;
  local_a28 = in_RDI;
  highbd_load_b_values_avx2();
  local_9c8 = local_a28;
  local_b60 = *(undefined8 *)*local_a28;
  uStack_b58 = *(undefined8 *)(*local_a28 + 8);
  uStack_b50 = *(undefined8 *)(*local_a28 + 0x10);
  uStack_b48 = *(undefined8 *)(*local_a28 + 0x18);
  local_b80 = vpabsd_avx2(*local_a28);
  local_9d0 = local_a28 + 1;
  local_ba0 = *(undefined8 *)*local_9d0;
  uStack_b98 = *(undefined8 *)(local_a28[1] + 8);
  uStack_b90 = *(undefined8 *)(local_a28[1] + 0x10);
  uStack_b88 = *(undefined8 *)(local_a28[1] + 0x18);
  local_bc0 = vpabsd_avx2(*local_9d0);
  local_980 = local_ba0;
  uStack_978 = uStack_b98;
  uStack_970 = uStack_b90;
  uStack_968 = uStack_b88;
  local_960 = local_b60;
  uStack_958 = uStack_b58;
  uStack_950 = uStack_b50;
  uStack_948 = uStack_b48;
  highbd_update_mask0_avx2(qcoeff0_00,qcoeff1_00,threshold_00,iscan_ptr,is_found,mask_01);
  local_860 = local_b80._0_8_;
  uStack_858 = local_b80._8_8_;
  uStack_850 = local_b80._16_8_;
  uStack_848 = local_b80._24_8_;
  local_880 = local_ac0._0_8_;
  uStack_878 = local_ac0._8_8_;
  uStack_870 = local_ac0._16_8_;
  uStack_868 = local_ac0._24_8_;
  local_ce0 = vpcmpgtd_avx2(local_b80,local_ac0);
  local_620 = local_ac0._0_8_;
  uStack_618 = local_ac0._8_8_;
  uStack_610 = local_ac0._16_8_;
  uStack_608 = local_ac0._24_8_;
  local_640 = local_ac0._0_8_;
  uStack_638 = local_ac0._8_8_;
  uStack_630 = local_ac0._16_8_;
  uStack_628 = local_ac0._24_8_;
  local_ac0 = vpunpckhqdq_avx2(local_ac0,local_ac0);
  local_8a0 = local_bc0._0_8_;
  uStack_898 = local_bc0._8_8_;
  uStack_890 = local_bc0._16_8_;
  uStack_888 = local_bc0._24_8_;
  local_8c0 = local_ac0._0_8_;
  uStack_8b8 = local_ac0._8_8_;
  uStack_8b0 = local_ac0._16_8_;
  uStack_8a8 = local_ac0._24_8_;
  _local_d00 = vpcmpgtd_avx2(local_bc0,local_ac0);
  uStack_588 = uStack_cc8;
  local_5c0 = local_d00;
  auVar3 = vpackssdw_avx2(local_ce0,_local_d00);
  local_be0 = vpermq_avx2(auVar3,0xd8);
  ptVar15 = (tran_low_t *)local_be0;
  piVar14 = scan;
  uStack_5b8 = mask_01;
  uStack_5b0 = is_found;
  uStack_5a8 = iscan_ptr;
  local_5a0 = threshold_00;
  uStack_598 = qcoeff1_00;
  uStack_590 = qcoeff0_00;
  highbd_update_mask1_avx2
            ((__m256i *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
             (int16_t *)CONCAT44(in_stack_fffffffffffff2cc,local_c50[1]),
             (int *)CONCAT44(local_c50[0],in_stack_fffffffffffff2c0),in_stack_fffffffffffff2b8);
  local_560 = local_be0._0_8_;
  uStack_558 = local_be0._8_8_;
  uStack_550 = local_be0._16_8_;
  lStack_548 = local_be0._24_8_;
  if ((((((((((((((((((((((((((((((((local_be0 >> 7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (local_be0 >> 0xf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_be0 >> 0x17 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_be0 >> 0x1f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_be0 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_be0 >> 0x2f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_be0 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_be0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_be0 >> 0x47 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_be0 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_be0 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_be0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_be0 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_be0 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_be0 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_be0 >> 0x7f,0) == '\0') &&
                    (local_be0 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_be0 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_be0 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_be0 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_be0 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (local_be0 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_be0 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_be0 >> 0xbf,0) == '\0') &&
            (local_be0 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_be0 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_be0 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_be0 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_be0 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (local_be0 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (local_be0 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      -1 < (long)local_be0._24_8_) {
    local_348 = in_stack_00000008;
    local_380 = local_aa0;
    uStack_378 = uStack_a98;
    uStack_370 = uStack_a90;
    uStack_368 = uStack_a88;
    *in_stack_00000008 = local_aa0;
    in_stack_00000008[1] = uStack_a98;
    in_stack_00000008[2] = uStack_a90;
    in_stack_00000008[3] = uStack_a88;
    local_388 = in_stack_00000008 + 4;
    local_3c0 = local_aa0;
    uStack_3b8 = uStack_a98;
    uStack_3b0 = uStack_a90;
    uStack_3a8 = uStack_a88;
    *local_388 = local_aa0;
    in_stack_00000008[5] = uStack_a98;
    in_stack_00000008[6] = uStack_a90;
    in_stack_00000008[7] = uStack_a88;
    local_3c8 = qcoeff_ptr;
    local_400 = local_aa0;
    uStack_3f8 = uStack_a98;
    uStack_3f0 = uStack_a90;
    uStack_3e8 = uStack_a88;
    *(undefined8 *)qcoeff_ptr = local_aa0;
    *(undefined8 *)(qcoeff_ptr + 2) = uStack_a98;
    *(undefined8 *)(qcoeff_ptr + 4) = uStack_a90;
    *(undefined8 *)(qcoeff_ptr + 6) = uStack_a88;
    local_408 = qcoeff_ptr + 8;
    local_440 = local_aa0;
    uStack_438 = uStack_a98;
    uStack_430 = uStack_a90;
    uStack_428 = uStack_a88;
    *(undefined8 *)local_408 = local_aa0;
    *(undefined8 *)(qcoeff_ptr + 10) = uStack_a98;
    *(undefined8 *)(qcoeff_ptr + 0xc) = uStack_a90;
    *(undefined8 *)(qcoeff_ptr + 0xe) = uStack_a88;
    local_660 = local_ae0._0_8_;
    uStack_658 = local_ae0._8_8_;
    uStack_650 = local_ae0._16_8_;
    uStack_648 = local_ae0._24_8_;
    local_680 = local_ae0._0_8_;
    uStack_678 = local_ae0._8_8_;
    uStack_670 = local_ae0._16_8_;
    uStack_668 = local_ae0._24_8_;
    local_ae0 = vpunpckhqdq_avx2(local_ae0,local_ae0);
    local_6a0 = local_b00._0_8_;
    uStack_698 = local_b00._8_8_;
    uStack_690 = local_b00._16_8_;
    uStack_688 = local_b00._24_8_;
    local_6c0 = local_b00._0_8_;
    uStack_6b8 = local_b00._8_8_;
    uStack_6b0 = local_b00._16_8_;
    uStack_6a8 = local_b00._24_8_;
    local_b00 = vpunpckhqdq_avx2(local_b00,local_b00);
    local_6e0 = local_b40._0_8_;
    uStack_6d8 = local_b40._8_8_;
    uStack_6d0 = local_b40._16_8_;
    uStack_6c8 = local_b40._24_8_;
    local_700 = local_b40._0_8_;
    uStack_6f8 = local_b40._8_8_;
    uStack_6f0 = local_b40._16_8_;
    uStack_6e8 = local_b40._24_8_;
    local_b40 = vpunpckhqdq_avx2(local_b40,local_b40);
    local_720 = local_b20._0_8_;
    uStack_718 = local_b20._8_8_;
    uStack_710 = local_b20._16_8_;
    uStack_708 = local_b20._24_8_;
    local_740 = local_b20._0_8_;
    uStack_738 = local_b20._8_8_;
    uStack_730 = local_b20._16_8_;
    uStack_728 = local_b20._24_8_;
    local_b20 = vpunpckhqdq_avx2(local_b20,local_b20);
    uVar12 = local_c50[0];
    uVar13 = local_c50[1];
  }
  else {
    piVar14 = (int16_t *)local_ae0;
    in_stack_fffffffffffff2a8 = local_b00;
    in_stack_fffffffffffff2b0 = local_b40;
    in_stack_fffffffffffff2b8 = (__m256i *)&local_c54;
    highbd_calculate_qcoeff_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
               (int *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
    local_760 = local_ae0._0_8_;
    uStack_758 = local_ae0._8_8_;
    uStack_750 = local_ae0._16_8_;
    uStack_748 = local_ae0._24_8_;
    local_780 = local_ae0._0_8_;
    uStack_778 = local_ae0._8_8_;
    uStack_770 = local_ae0._16_8_;
    uStack_768 = local_ae0._24_8_;
    local_ae0 = vpunpckhqdq_avx2(local_ae0,local_ae0);
    local_7a0 = local_b00._0_8_;
    uStack_798 = local_b00._8_8_;
    uStack_790 = local_b00._16_8_;
    uStack_788 = local_b00._24_8_;
    local_7c0 = local_b00._0_8_;
    uStack_7b8 = local_b00._8_8_;
    uStack_7b0 = local_b00._16_8_;
    uStack_7a8 = local_b00._24_8_;
    local_b00 = vpunpckhqdq_avx2(local_b00,local_b00);
    local_7e0 = local_b40._0_8_;
    uStack_7d8 = local_b40._8_8_;
    uStack_7d0 = local_b40._16_8_;
    uStack_7c8 = local_b40._24_8_;
    local_800 = local_b40._0_8_;
    uStack_7f8 = local_b40._8_8_;
    uStack_7f0 = local_b40._16_8_;
    uStack_7e8 = local_b40._24_8_;
    local_b40 = vpunpckhqdq_avx2(local_b40,local_b40);
    in_stack_fffffffffffff2a0 = piVar14;
    highbd_calculate_qcoeff_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
               (int *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
    local_260 = local_b80._0_8_;
    uStack_258 = local_b80._8_8_;
    uStack_250 = local_b80._16_8_;
    uStack_248 = local_b80._24_8_;
    local_280 = local_b60;
    uStack_278 = uStack_b58;
    uStack_270 = uStack_b50;
    uStack_268 = uStack_b48;
    auVar7._8_8_ = uStack_b58;
    auVar7._0_8_ = local_b60;
    auVar7._16_8_ = uStack_b50;
    auVar7._24_8_ = uStack_b48;
    auVar3 = vpsignd_avx2(local_b80,auVar7);
    local_2a0 = local_bc0._0_8_;
    uStack_298 = local_bc0._8_8_;
    uStack_290 = local_bc0._16_8_;
    uStack_288 = local_bc0._24_8_;
    local_2c0 = local_ba0;
    uStack_2b8 = uStack_b98;
    uStack_2b0 = uStack_b90;
    uStack_2a8 = uStack_b88;
    auVar4._8_8_ = uStack_b98;
    auVar4._0_8_ = local_ba0;
    auVar4._16_8_ = uStack_b90;
    auVar4._24_8_ = uStack_b88;
    auVar4 = vpsignd_avx2(local_bc0,auVar4);
    local_b80._0_8_ = auVar3._0_8_;
    local_b80._8_8_ = auVar3._8_8_;
    local_b80._16_8_ = auVar3._16_8_;
    local_b80._24_8_ = auVar3._24_8_;
    local_160 = local_b80._0_8_;
    uStack_158 = local_b80._8_8_;
    uStack_150 = local_b80._16_8_;
    uStack_148 = local_b80._24_8_;
    uStack_168 = uStack_cc8;
    local_b80 = vpand_avx2(auVar3,local_ce0);
    local_bc0._0_8_ = auVar4._0_8_;
    local_bc0._8_8_ = auVar4._8_8_;
    local_bc0._16_8_ = auVar4._16_8_;
    local_bc0._24_8_ = auVar4._24_8_;
    local_1a0 = local_bc0._0_8_;
    uStack_198 = local_bc0._8_8_;
    uStack_190 = local_bc0._16_8_;
    uStack_188 = local_bc0._24_8_;
    local_1c0 = local_d00;
    local_bc0 = vpand_avx2(auVar4,_local_d00);
    coeff0_00[1]._0_4_ = in_stack_fffffffffffff2c0;
    coeff0_00[0] = (longlong)in_stack_fffffffffffff2b8;
    coeff0_00[1]._4_4_ = local_c50[0];
    coeff0_00[2]._0_4_ = local_c50[1];
    coeff0_00[2]._4_4_ = in_stack_fffffffffffff2cc;
    coeff0_00[3]._0_4_ = in_stack_fffffffffffff2d0;
    coeff0_00[3]._4_4_ = in_stack_fffffffffffff2d4;
    coeff1_00[1] = (longlong)in_stack_fffffffffffff2a0;
    coeff1_00[0] = (longlong)puVar26;
    coeff1_00[2] = (longlong)in_stack_fffffffffffff2a8;
    coeff1_00[3] = (longlong)in_stack_fffffffffffff2b0;
    uStack_1b8 = mask_01;
    uStack_1b0 = is_found;
    uStack_1a8 = iscan_ptr;
    local_180 = threshold_00;
    uStack_178 = qcoeff1_00;
    uStack_170 = qcoeff0_00;
    highbd_store_coefficients_avx2(coeff0_00,coeff1_00,in_R9);
    qcoeff_00[1] = (longlong)in_stack_fffffffffffff2a0;
    qcoeff_00[0] = (longlong)puVar26;
    qcoeff_00[2] = (longlong)in_stack_fffffffffffff2a8;
    qcoeff_00[3] = (longlong)in_stack_fffffffffffff2b0;
    dequant_00[1] = (longlong)ptVar24;
    dequant_00[0] = 0x67faf2;
    dequant_00[2] = (longlong)puVar25;
    dequant_00[3] = (longlong)in_R9;
    uVar16 = local_b80._0_8_;
    uVar18 = local_b80._8_8_;
    uVar20 = local_b80._16_8_;
    uVar22 = local_b80._24_8_;
    highbd_calculate_dqcoeff_avx2(qcoeff_00,dequant_00);
    local_820 = local_b20._0_8_;
    uStack_818 = local_b20._8_8_;
    uStack_810 = local_b20._16_8_;
    uStack_808 = local_b20._24_8_;
    local_840 = local_b20._0_8_;
    uStack_838 = local_b20._8_8_;
    uStack_830 = local_b20._16_8_;
    uStack_828 = local_b20._24_8_;
    local_b20 = vpunpckhqdq_avx2(local_b20,local_b20);
    qcoeff_01[1] = (longlong)in_stack_fffffffffffff2a0;
    qcoeff_01[0] = (longlong)puVar26;
    qcoeff_01[2] = (longlong)in_stack_fffffffffffff2a8;
    qcoeff_01[3] = (longlong)in_stack_fffffffffffff2b0;
    dequant_01[1] = (longlong)ptVar24;
    dequant_01[0] = 0x67fb4c;
    dequant_01[2] = (longlong)puVar25;
    dequant_01[3] = (longlong)in_R9;
    uVar17 = local_bc0._0_8_;
    uVar19 = local_bc0._8_8_;
    uVar21 = local_bc0._16_8_;
    uVar23 = local_bc0._24_8_;
    local_b60 = uVar16;
    uStack_b58 = uVar18;
    uStack_b50 = uVar20;
    uStack_b48 = uVar22;
    highbd_calculate_dqcoeff_avx2(qcoeff_01,dequant_01);
    coeff0_01[1]._0_4_ = in_stack_fffffffffffff2c0;
    coeff0_01[0] = (longlong)in_stack_fffffffffffff2b8;
    coeff0_01[1]._4_4_ = local_c50[0];
    coeff0_01[2]._0_4_ = local_c50[1];
    coeff0_01[2]._4_4_ = in_stack_fffffffffffff2cc;
    coeff0_01[3]._0_4_ = in_stack_fffffffffffff2d0;
    coeff0_01[3]._4_4_ = in_stack_fffffffffffff2d4;
    coeff1_01[1] = (longlong)in_stack_fffffffffffff2a0;
    coeff1_01[0] = (longlong)puVar26;
    coeff1_01[2] = (longlong)in_stack_fffffffffffff2a8;
    coeff1_01[3] = (longlong)in_stack_fffffffffffff2b0;
    ptVar15 = qcoeff_ptr;
    local_ba0 = uVar17;
    uStack_b98 = uVar19;
    uStack_b90 = uVar21;
    uStack_b88 = uVar23;
    highbd_store_coefficients_avx2(coeff0_01,coeff1_01,in_R9);
    uVar12 = local_c50[0];
    uVar13 = local_c50[1];
  }
  while (local_a54 < local_a30) {
    local_9d8 = (undefined1 (*) [32])(*local_a28 + (long)local_a54 * 4);
    local_b60 = *(undefined8 *)*local_9d8;
    uStack_b58 = *(undefined8 *)(*local_9d8 + 8);
    uStack_b50 = *(undefined8 *)(*local_9d8 + 0x10);
    uStack_b48 = *(undefined8 *)(*local_9d8 + 0x18);
    local_b80 = vpabsd_avx2(*local_9d8);
    local_9e0 = (undefined1 (*) [32])(local_a28[1] + (long)local_a54 * 4);
    local_ba0 = *(undefined8 *)*local_9e0;
    uStack_b98 = *(undefined8 *)(*local_9e0 + 8);
    uStack_b90 = *(undefined8 *)(*local_9e0 + 0x10);
    uStack_b88 = *(undefined8 *)(*local_9e0 + 0x18);
    local_bc0 = vpabsd_avx2(*local_9e0);
    local_9c0 = local_ba0;
    uStack_9b8 = uStack_b98;
    uStack_9b0 = uStack_b90;
    uStack_9a8 = uStack_b88;
    local_9a0 = local_b60;
    uStack_998 = uStack_b58;
    uStack_990 = uStack_b50;
    uStack_988 = uStack_b48;
    highbd_update_mask0_avx2(qcoeff0_00,qcoeff1_00,threshold_00,iscan_ptr,is_found,mask_01);
    local_8e0 = local_b80._0_8_;
    uStack_8d8 = local_b80._8_8_;
    uStack_8d0 = local_b80._16_8_;
    uStack_8c8 = local_b80._24_8_;
    local_900 = local_ac0._0_8_;
    uStack_8f8 = local_ac0._8_8_;
    uStack_8f0 = local_ac0._16_8_;
    uStack_8e8 = local_ac0._24_8_;
    local_ce0 = vpcmpgtd_avx2(local_b80,local_ac0);
    local_920 = local_bc0._0_8_;
    uStack_918 = local_bc0._8_8_;
    uStack_910 = local_bc0._16_8_;
    uStack_908 = local_bc0._24_8_;
    local_940 = local_ac0._0_8_;
    uStack_938 = local_ac0._8_8_;
    uStack_930 = local_ac0._16_8_;
    uStack_928 = local_ac0._24_8_;
    _local_d00 = vpcmpgtd_avx2(local_bc0,local_ac0);
    uStack_5c8 = uStack_cc8;
    local_600 = local_d00;
    auVar3 = vpackssdw_avx2(local_ce0,_local_d00);
    local_be0 = vpermq_avx2(auVar3,0xd8);
    piVar14 = scan + local_a54;
    ptVar15 = (tran_low_t *)local_be0;
    uStack_5f8 = mask_01;
    uStack_5f0 = is_found;
    uStack_5e8 = iscan_ptr;
    local_5e0 = threshold_00;
    uStack_5d8 = qcoeff1_00;
    uStack_5d0 = qcoeff0_00;
    highbd_update_mask1_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
               (int16_t *)CONCAT44(in_stack_fffffffffffff2cc,uVar13),
               (int *)CONCAT44(uVar12,in_stack_fffffffffffff2c0),in_stack_fffffffffffff2b8);
    local_580 = local_be0._0_8_;
    uStack_578 = local_be0._8_8_;
    uStack_570 = local_be0._16_8_;
    lStack_568 = local_be0._24_8_;
    if ((((((((((((((((((((((((((((((((local_be0 >> 7 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (local_be0 >> 0xf & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_be0 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_be0 >> 0x1f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_be0 >> 0x27 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_be0 >> 0x2f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_be0 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_be0 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_be0 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_be0 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_be0 >> 0x57 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_be0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_be0 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_be0 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_be0 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_be0 >> 0x7f,0) == '\0') &&
                      (local_be0 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_be0 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_be0 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_be0 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_be0 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_be0 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_be0 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_be0 >> 0xbf,0) == '\0') &&
              (local_be0 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (local_be0 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_be0 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_be0 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_be0 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_be0 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_be0 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        -1 < (long)local_be0._24_8_) {
      local_448 = (undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4);
      local_480 = local_aa0;
      uStack_478 = uStack_a98;
      uStack_470 = uStack_a90;
      uStack_468 = uStack_a88;
      *local_448 = local_aa0;
      local_448[1] = uStack_a98;
      local_448[2] = uStack_a90;
      local_448[3] = uStack_a88;
      local_488 = (undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4 + 0x20);
      local_4c0 = local_aa0;
      uStack_4b8 = uStack_a98;
      uStack_4b0 = uStack_a90;
      uStack_4a8 = uStack_a88;
      *local_488 = local_aa0;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4 + 0x28) = uStack_a98;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4 + 0x30) = uStack_a90;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_a54 * 4 + 0x38) = uStack_a88;
      local_4c8 = qcoeff_ptr + local_a54;
      local_500 = local_aa0;
      uStack_4f8 = uStack_a98;
      uStack_4f0 = uStack_a90;
      uStack_4e8 = uStack_a88;
      *(undefined8 *)local_4c8 = local_aa0;
      *(undefined8 *)(local_4c8 + 2) = uStack_a98;
      *(undefined8 *)(local_4c8 + 4) = uStack_a90;
      *(undefined8 *)(local_4c8 + 6) = uStack_a88;
      local_508 = qcoeff_ptr + (long)local_a54 + 8;
      local_540 = local_aa0;
      uStack_538 = uStack_a98;
      uStack_530 = uStack_a90;
      uStack_528 = uStack_a88;
      *(undefined8 *)local_508 = local_aa0;
      *(undefined8 *)(qcoeff_ptr + (long)local_a54 + 10) = uStack_a98;
      *(undefined8 *)(qcoeff_ptr + (long)local_a54 + 0xc) = uStack_a90;
      *(undefined8 *)(qcoeff_ptr + (long)local_a54 + 0xe) = uStack_a88;
      local_a54 = local_a54 + 0x10;
    }
    else {
      highbd_calculate_qcoeff_avx2
                ((__m256i *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                 (int *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
      piVar14 = (int16_t *)local_ae0;
      highbd_calculate_qcoeff_avx2
                ((__m256i *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                 (int *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
      local_2e0 = local_b80._0_8_;
      uStack_2d8 = local_b80._8_8_;
      uStack_2d0 = local_b80._16_8_;
      uStack_2c8 = local_b80._24_8_;
      local_300 = local_b60;
      uStack_2f8 = uStack_b58;
      uStack_2f0 = uStack_b50;
      uStack_2e8 = uStack_b48;
      auVar6._8_8_ = uStack_b58;
      auVar6._0_8_ = local_b60;
      auVar6._16_8_ = uStack_b50;
      auVar6._24_8_ = uStack_b48;
      auVar3 = vpsignd_avx2(local_b80,auVar6);
      local_320 = local_bc0._0_8_;
      uStack_318 = local_bc0._8_8_;
      uStack_310 = local_bc0._16_8_;
      uStack_308 = local_bc0._24_8_;
      local_340 = local_ba0;
      uStack_338 = uStack_b98;
      uStack_330 = uStack_b90;
      uStack_328 = uStack_b88;
      auVar5._8_8_ = uStack_b98;
      auVar5._0_8_ = local_ba0;
      auVar5._16_8_ = uStack_b90;
      auVar5._24_8_ = uStack_b88;
      auVar4 = vpsignd_avx2(local_bc0,auVar5);
      local_b80._0_8_ = auVar3._0_8_;
      local_b80._8_8_ = auVar3._8_8_;
      local_b80._16_8_ = auVar3._16_8_;
      local_b80._24_8_ = auVar3._24_8_;
      local_1e0 = local_b80._0_8_;
      uStack_1d8 = local_b80._8_8_;
      uStack_1d0 = local_b80._16_8_;
      uStack_1c8 = local_b80._24_8_;
      uStack_1e8 = uStack_cc8;
      local_b80 = vpand_avx2(auVar3,local_ce0);
      local_bc0._0_8_ = auVar4._0_8_;
      local_bc0._8_8_ = auVar4._8_8_;
      local_bc0._16_8_ = auVar4._16_8_;
      local_bc0._24_8_ = auVar4._24_8_;
      local_220 = local_bc0._0_8_;
      uStack_218 = local_bc0._8_8_;
      uStack_210 = local_bc0._16_8_;
      uStack_208 = local_bc0._24_8_;
      local_240 = local_d00;
      local_bc0 = vpand_avx2(auVar4,_local_d00);
      coeff0_02[1]._0_4_ = in_stack_fffffffffffff2c0;
      coeff0_02[0] = (longlong)in_stack_fffffffffffff2b8;
      coeff0_02[1]._4_4_ = uVar12;
      coeff0_02[2]._0_4_ = uVar13;
      coeff0_02[2]._4_4_ = in_stack_fffffffffffff2cc;
      coeff0_02[3]._0_4_ = in_stack_fffffffffffff2d0;
      coeff0_02[3]._4_4_ = in_stack_fffffffffffff2d4;
      coeff1_02[1] = (longlong)in_stack_fffffffffffff2a0;
      coeff1_02[0] = (longlong)puVar26;
      coeff1_02[2] = (longlong)in_stack_fffffffffffff2a8;
      coeff1_02[3] = (longlong)in_stack_fffffffffffff2b0;
      uStack_238 = mask_01;
      uStack_230 = is_found;
      uStack_228 = iscan_ptr;
      local_200 = threshold_00;
      uStack_1f8 = qcoeff1_00;
      uStack_1f0 = qcoeff0_00;
      highbd_store_coefficients_avx2(coeff0_02,coeff1_02,in_R9);
      qcoeff_02[1] = (longlong)in_stack_fffffffffffff2a0;
      qcoeff_02[0] = (longlong)puVar26;
      qcoeff_02[2] = (longlong)in_stack_fffffffffffff2a8;
      qcoeff_02[3] = (longlong)in_stack_fffffffffffff2b0;
      dequant_02[1] = (longlong)ptVar24;
      dequant_02[0] = 0x680068;
      dequant_02[2] = (longlong)puVar25;
      dequant_02[3] = (longlong)in_R9;
      uVar16 = local_b80._0_8_;
      uVar18 = local_b80._8_8_;
      uVar20 = local_b80._16_8_;
      uVar22 = local_b80._24_8_;
      highbd_calculate_dqcoeff_avx2(qcoeff_02,dequant_02);
      qcoeff_03[1] = (longlong)in_stack_fffffffffffff2a0;
      qcoeff_03[0] = (longlong)puVar26;
      qcoeff_03[2] = (longlong)in_stack_fffffffffffff2a8;
      qcoeff_03[3] = (longlong)in_stack_fffffffffffff2b0;
      dequant_03[1] = (longlong)ptVar24;
      dequant_03[0] = 0x680088;
      dequant_03[2] = (longlong)puVar25;
      dequant_03[3] = (longlong)in_R9;
      uVar17 = local_bc0._0_8_;
      uVar19 = local_bc0._8_8_;
      uVar21 = local_bc0._16_8_;
      uVar23 = local_bc0._24_8_;
      local_b60 = uVar16;
      uStack_b58 = uVar18;
      uStack_b50 = uVar20;
      uStack_b48 = uVar22;
      highbd_calculate_dqcoeff_avx2(qcoeff_03,dequant_03);
      ptVar15 = qcoeff_ptr + local_a54;
      coeff0_03[1]._0_4_ = in_stack_fffffffffffff2c0;
      coeff0_03[0] = (longlong)in_stack_fffffffffffff2b8;
      coeff0_03[1]._4_4_ = uVar12;
      coeff0_03[2]._0_4_ = uVar13;
      coeff0_03[2]._4_4_ = in_stack_fffffffffffff2cc;
      coeff0_03[3]._0_4_ = in_stack_fffffffffffff2d0;
      coeff0_03[3]._4_4_ = in_stack_fffffffffffff2d4;
      coeff1_03[1] = (longlong)in_stack_fffffffffffff2a0;
      coeff1_03[0] = (longlong)puVar26;
      coeff1_03[2] = (longlong)in_stack_fffffffffffff2a8;
      coeff1_03[3] = (longlong)in_stack_fffffffffffff2b0;
      local_ba0 = uVar17;
      uStack_b98 = uVar19;
      uStack_b90 = uVar21;
      uStack_b88 = uVar23;
      highbd_store_coefficients_avx2(coeff0_03,coeff1_03,in_R9);
      local_a54 = local_a54 + 0x10;
    }
  }
  if (local_a60 != 0) {
    local_e0 = local_c00;
    uStack_d8 = uStack_bf8;
    uStack_d0 = uStack_bf0;
    uStack_c8 = uStack_be8;
    local_110 = local_c00;
    uStack_108 = uStack_bf8;
    local_120 = uStack_bf0;
    uStack_118 = uStack_be8;
    auVar10._8_8_ = uStack_bf8;
    auVar10._0_8_ = local_c00;
    auVar2._8_8_ = uStack_be8;
    auVar2._0_8_ = uStack_bf0;
    local_c30 = vpmaxsw_avx(auVar10,auVar2);
    mask[1] = (longlong)piVar14;
    mask[0] = (longlong)ptVar15;
    local_a58 = calculate_non_zero_count(mask);
  }
  local_d04 = local_a5c;
  if (local_a64 != 0) {
    local_100 = local_c20;
    uStack_f8 = uStack_c18;
    uStack_f0 = uStack_c10;
    uStack_e8 = uStack_c08;
    local_130 = local_c20;
    uStack_128 = uStack_c18;
    local_140 = uStack_c10;
    uStack_138 = uStack_c08;
    auVar9._8_8_ = uStack_c18;
    auVar9._0_8_ = local_c20;
    auVar8._8_8_ = uStack_c08;
    auVar8._0_8_ = uStack_c10;
    local_c40 = vpmaxsw_avx(auVar9,auVar8);
    mask_00[1] = (longlong)piVar14;
    mask_00[0] = (longlong)ptVar15;
    local_d04 = calculate_non_zero_count(mask_00);
  }
  while (local_d04 = local_d04 + -1, iVar27 = local_a58, local_a58 <= local_d04) {
    uVar1 = eob_ptr[local_d04];
    *(undefined4 *)((long)in_stack_00000008 + (long)(int)(short)uVar1 * 4) = 0;
    qcoeff_ptr[(int)(short)uVar1] = 0;
  }
  do {
    iVar27 = iVar27 + -1;
    iVar11 = local_a68;
    if (iVar27 < 0) break;
    iVar11 = iVar27;
  } while (*(int *)((long)in_stack_00000008 + (long)(int)(short)eob_ptr[iVar27] * 4) == 0);
  local_a68 = iVar11;
  *dequant_ptr = (short)local_a68 + 1;
  iVar27 = 0;
  while ((iVar11 = local_ca4, iVar27 < local_a58 &&
         (iVar11 = iVar27,
         *(int *)((long)in_stack_00000008 + (long)(int)(short)eob_ptr[iVar27] * 4) == 0))) {
    iVar27 = iVar27 + 1;
  }
  local_ca4 = iVar11;
  if (((-1 < (int)((ushort)*dequant_ptr - 1)) && (local_ca4 == (ushort)*dequant_ptr - 1)) &&
     ((iVar27 = (int)(short)eob_ptr[(int)((ushort)*dequant_ptr - 1)],
      *(int *)((long)in_stack_00000008 + (long)iVar27 * 4) == 1 ||
      (*(int *)((long)in_stack_00000008 + (long)iVar27 * 4) == -1)))) {
    uVar12 = *(int *)(*local_a28 + (long)iVar27 * 4) << 5;
    uVar13 = 0;
    if ((int)uVar12 < 0) {
      uVar13 = 0xffffffff;
    }
    if ((int)((uVar12 ^ uVar13) - uVar13) <
        *(short *)(local_a38 + (long)(int)(uint)(iVar27 != 0) * 2) * 0x20 +
        (*(short *)((long)dqcoeff_ptr + (long)(int)(uint)(iVar27 != 0) * 2) * 0x20d + 0x40 >> 7)) {
      *(undefined4 *)((long)in_stack_00000008 + (long)iVar27 * 4) = 0;
      qcoeff_ptr[iVar27] = 0;
      *dequant_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff0, qcoeff0, coeff1, qcoeff1;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  int prescan_add[2];
  int thresh[2];
  const int log_scale = 0;
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  highbd_load_b_values_avx2(zbin_ptr, &zbin, round_ptr, &round, quant_ptr,
                            &quant, dequant_ptr, &dequant, quant_shift_ptr,
                            &shift);

  // Do DC and first 15 AC.
  coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr));
  qcoeff0 = _mm256_abs_epi32(coeff0);
  coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + 8));
  qcoeff1 = _mm256_abs_epi32(coeff1);
  highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0,
                           &mask0);
  __m256i temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm256_unpackhi_epi64(zbin, zbin);
  __m256i temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    // Reinsert signs
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    // Mask out zbin threshold coeffs
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr);
    coeff0 = highbd_calculate_dqcoeff_avx2(qcoeff0, dequant);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff_avx2(qcoeff1, dequant);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr + index));
    qcoeff0 = _mm256_abs_epi32(coeff0);
    coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + index + 8));
    qcoeff1 = _mm256_abs_epi32(coeff1);
    highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan + index,
                             &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
    temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
    highbd_update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr + index);
    coeff0 = highbd_calculate_dqcoeff_avx2(qcoeff0, dequant);
    coeff1 = highbd_calculate_dqcoeff_avx2(qcoeff1, dequant);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}